

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadSegs<mapseg_t>(MapData *map)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  FileReader *pFVar5;
  double *pdVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  double dVar9;
  vertex_t *pvVar10;
  vertex_t *pvVar11;
  seg_t *psVar12;
  int iVar13;
  void *__s;
  void *pvVar14;
  long lVar15;
  undefined4 *puVar16;
  long lVar17;
  vertex_t **ppvVar18;
  uint uVar19;
  line_t_conflict *plVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  
  uVar21 = (ulong)numvertexes;
  __s = operator_new__(uVar21);
  pFVar5 = map->MapLumps[5].Reader;
  if (pFVar5 == (FileReader *)0x0) {
    uVar23 = 0;
  }
  else {
    uVar23 = (ulong)(int)pFVar5->Length;
  }
  memset(__s,0,uVar21);
  numsegs = (int)(uVar23 / 0xc);
  if (numsegs == 0) {
    Printf("This map has no segs.\n");
    if (subsectors != (subsector_t *)0x0) {
      operator_delete__(subsectors);
    }
    if (nodes != (node_t *)0x0) {
      operator_delete__(nodes);
    }
    operator_delete__(__s);
    ForceNodeBuild = true;
    return;
  }
  uVar22 = (ulong)numsegs;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar22;
  uVar21 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0x30),8) == 0) {
    uVar21 = SUB168(auVar8 * ZEXT816(0x30),0);
  }
  segs = (seg_t *)operator_new__(uVar21);
  memset(segs,0,uVar22 * 0x30);
  pvVar14 = operator_new__(uVar23);
  lVar15 = pFVar5->Length;
  map->file = pFVar5;
  (*(pFVar5->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar5,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,pvVar14,(long)(int)lVar15);
  lVar15 = (long)numsubsectors;
  if (0 < lVar15) {
    lVar17 = 0;
    do {
      *(seg_t **)((long)&subsectors->firstline + lVar17) =
           segs + *(long *)((long)&subsectors->firstline + lVar17);
      lVar17 = lVar17 + 0x30;
    } while (lVar15 * 0x30 != lVar17);
  }
  pvVar10 = vertexes;
  if (0 < numlines) {
    ppvVar18 = &lines->v2;
    iVar13 = numlines;
    do {
      *(undefined1 *)((long)__s + ((long)*ppvVar18 - (long)pvVar10 >> 4)) = 1;
      *(undefined1 *)
       ((long)__s + ((long)((line_t_conflict *)(ppvVar18 + -1))->v1 - (long)pvVar10 >> 4)) = 1;
      ppvVar18 = ppvVar18 + 0x13;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  if (0 < numsegs) {
    lVar15 = 0;
    lVar17 = 0;
    do {
      psVar12 = segs;
      pvVar10 = vertexes;
      uVar2 = *(ushort *)((long)pvVar14 + lVar15);
      uVar3 = *(ushort *)((long)pvVar14 + lVar15 + 2);
      uVar21 = (ulong)uVar3;
      if ((numvertexes <= (int)(uint)uVar2) || (numvertexes <= (int)(uint)uVar3)) {
        puVar16 = (undefined4 *)__cxa_allocate_exception(0xc);
        uVar19 = (uint)uVar3;
        if ((uint)uVar3 < (uint)uVar2) {
          uVar19 = (uint)uVar2;
        }
        *puVar16 = 0;
        puVar16[1] = (int)lVar17;
        puVar16[2] = uVar19;
        __cxa_throw(puVar16,&badseg::typeinfo,0);
      }
      *(vertex_t **)((long)&segs->v1 + lVar15 * 4) = vertexes + uVar2;
      pvVar11 = vertexes;
      *(vertex_t **)((long)&psVar12->v2 + lVar15 * 4) = vertexes + uVar3;
      uVar4 = *(ushort *)((long)pvVar14 + lVar15 + 4);
      dVar9 = c_atan2(pvVar11[uVar3].p.Y - pvVar10[uVar2].p.Y,
                      pvVar11[uVar3].p.X - pvVar10[uVar2].p.X);
      dVar25 = (double)((ulong)uVar4 << 0x10) * 8.381903171539307e-08;
      if (1.0 <= ABS((double)SUB84((dVar9 * 57.29577951308232 - dVar25) * 11930464.711111112 +
                                   6755399441055744.0,0) * 8.381903171539307e-08)) {
        pdVar6 = *(double **)((long)&psVar12->v1 + lVar15 * 4);
        pdVar7 = *(double **)((long)&psVar12->v2 + lVar15 * 4);
        dVar24 = *pdVar7 - *pdVar6;
        dVar9 = pdVar7[1] - pdVar6[1];
        dVar9 = c_sqrt(dVar9 * dVar9 + dVar24 * dVar24);
        dVar25 = FFastTrig::cos(&fasttrig,dVar25 * 11930464.711111112 + 6755399441055744.0);
        dVar24 = FFastTrig::sin(&fasttrig,dVar25);
        if ((uVar2 < uVar3) && (*(char *)((long)__s + uVar21) == '\0')) {
          pdVar6 = *(double **)((long)&psVar12->v1 + lVar15 * 4);
          pdVar7 = *(double **)((long)&psVar12->v2 + lVar15 * 4);
          dVar1 = *pdVar6;
          pdVar7[1] = dVar24 * dVar9 + pdVar6[1];
          *pdVar7 = dVar25 * dVar9 + dVar1;
        }
        else {
          if (*(char *)((long)__s + (ulong)uVar2) != '\0') goto LAB_0044e483;
          pdVar6 = *(double **)((long)&psVar12->v1 + lVar15 * 4);
          pdVar7 = *(double **)((long)&psVar12->v2 + lVar15 * 4);
          dVar1 = *pdVar7;
          pdVar6[1] = pdVar7[1] - dVar24 * dVar9;
          *pdVar6 = dVar1 - dVar25 * dVar9;
          uVar21 = (ulong)uVar2;
        }
        *(undefined1 *)((long)__s + uVar21) = 1;
      }
LAB_0044e483:
      uVar2 = *(ushort *)((long)pvVar14 + lVar15 + 6);
      uVar19 = (uint)uVar2;
      if ((uint)numlines <= (uint)uVar2) {
        puVar16 = (undefined4 *)__cxa_allocate_exception(0xc);
        *puVar16 = 1;
LAB_0044e5d2:
        puVar16[1] = (int)lVar17;
        puVar16[2] = uVar19;
        __cxa_throw(puVar16,&badseg::typeinfo,0);
      }
      plVar20 = lines + uVar2;
      *(line_t_conflict **)((long)&psVar12->linedef + lVar15 * 4) = plVar20;
      uVar21 = (ulong)*(short *)((long)pvVar14 + lVar15 + 8);
      if ((uint)numsides <=
          (uint)((int)((ulong)((long)plVar20->sidedef[uVar21] - (long)sides) >> 6) * -0x55555555)) {
        puVar16 = (undefined4 *)__cxa_allocate_exception(0xc);
        uVar19 = (int)((ulong)((long)plVar20->sidedef[uVar21] - (long)sides) >> 6) * -0x55555555;
        *puVar16 = 2;
        goto LAB_0044e5d2;
      }
      *(side_t **)((long)&psVar12->sidedef + lVar15 * 4) = plVar20->sidedef[uVar21];
      *(sector_t_conflict **)((long)&psVar12->frontsector + lVar15 * 4) =
           plVar20->sidedef[uVar21]->sector;
      uVar19 = plVar20->flags;
      if (((uVar19 & 4) == 0) || (plVar20->sidedef[uVar21 ^ 1] == (side_t *)0x0)) {
        *(undefined8 *)((long)&psVar12->backsector + lVar15 * 4) = 0;
        plVar20->flags = uVar19 & 0xfffffffb;
      }
      else {
        *(sector_t_conflict **)((long)&psVar12->backsector + lVar15 * 4) =
             plVar20->sidedef[uVar21 ^ 1]->sector;
      }
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar17 < numsegs);
  }
  operator_delete__(__s);
  operator_delete__(pvVar14);
  return;
}

Assistant:

void P_LoadSegs (MapData * map)
{
	int  i;
	BYTE *data;
	BYTE *vertchanged = new BYTE[numvertexes];	// phares 10/4/98
	DWORD segangle;
	line_t* line;		// phares 10/4/98
	//int ptp_angle;		// phares 10/4/98
	//int delta_angle;	// phares 10/4/98
	int vnum1,vnum2;	// phares 10/4/98
	int lumplen = map->Size(ML_SEGS);

	memset (vertchanged,0,numvertexes); // phares 10/4/98

	numsegs = lumplen / sizeof(segtype);

	if (numsegs == 0)
	{
		Printf ("This map has no segs.\n");
		delete[] subsectors;
		delete[] nodes;
		delete[] vertchanged;
		ForceNodeBuild = true;
		return;
	}

	segs = new seg_t[numsegs];
	memset (segs, 0, numsegs*sizeof(seg_t));

	data = new BYTE[lumplen];
	map->Read(ML_SEGS, data);

	for (i = 0; i < numsubsectors; ++i)
	{
		subsectors[i].firstline = &segs[(size_t)subsectors[i].firstline];
	}

	// phares: 10/4/98: Vertchanged is an array that represents the vertices.
	// Mark those used by linedefs. A marked vertex is one that is not a
	// candidate for movement further down.

	line = lines;
	for (i = 0; i < numlines ; i++, line++)
	{
		vertchanged[line->v1 - vertexes] = vertchanged[line->v2 - vertexes] = 1;
	}

	try
	{
		for (i = 0; i < numsegs; i++)
		{
			seg_t *li = segs + i;
			segtype *ml = ((segtype *) data) + i;

			int side, linedef;
			line_t *ldef;

			vnum1 = ml->V1();
			vnum2 = ml->V2();

			if (vnum1 >= numvertexes || vnum2 >= numvertexes)
			{
				throw badseg(0, i, MAX(vnum1, vnum2));
			}

			li->v1 = &vertexes[vnum1];
			li->v2 = &vertexes[vnum2];

			segangle = (WORD)LittleShort(ml->angle);

			// phares 10/4/98: In the case of a lineseg that was created by splitting
			// another line, it appears that the line angle is inherited from the
			// father line. Due to roundoff, the new vertex may have been placed 'off
			// the line'. When you get close to such a line, and it is very short,
			// it's possible that the roundoff error causes 'firelines', the thin
			// lines that can draw from screen top to screen bottom occasionally. This
			// is due to all the angle calculations that are done based on the line
			// angle, the angles from the viewer to the vertices, and the viewer's
			// angle in the world. In the case of firelines, the rounded-off position
			// of one of the vertices determines one of these angles, and introduces
			// an error in the scaling factor for mapping textures and determining
			// where on the screen the ceiling and floor spans should be shown. For a
			// fireline, the engine thinks the ceiling bottom and floor top are at the
			// midpoint of the screen. So you get ceilings drawn all the way down to the
			// screen midpoint, and floors drawn all the way up. Thus 'firelines'. The
			// name comes from the original sighting, which involved a fire texture.
			//
			// To correct this, reset the vertex that was added so that it sits ON the
			// split line.
			//
			// To know which of the two vertices was added, its number is greater than
			// that of the last of the author-created vertices. If both vertices of the
			// line were added by splitting, pick the higher-numbered one. Once you've
			// changed a vertex, don't change it again if it shows up in another seg.
			//
			// To determine if there's an error in the first place, find the
			// angle of the line between the two seg vertices. If it's one degree or more
			// off, then move one vertex. This may seem insignificant, but one degree
			// errors _can_ cause firelines.

			DAngle ptp_angle = (li->v2->fPos() - li->v1->fPos()).Angle();
			DAngle seg_angle = AngleToFloat(segangle << 16);
			DAngle delta_angle = absangle(ptp_angle, seg_angle);

			if (delta_angle >= 1.)
			{
				double dis = (li->v2->fPos() - li->v1->fPos()).Length();
				DVector2 delta = seg_angle.ToVector(dis);
				if ((vnum2 > vnum1) && (vertchanged[vnum2] == 0))
				{
					li->v2->set(li->v1->fPos() + delta);
					vertchanged[vnum2] = 1; // this was changed
				}
				else if (vertchanged[vnum1] == 0)
				{
					li->v1->set(li->v2->fPos() - delta);
					vertchanged[vnum1] = 1; // this was changed
				}
			}

			linedef = LittleShort(ml->linedef);
			if ((unsigned)linedef >= (unsigned)numlines)
			{
				throw badseg(1, i, linedef);
			}
			ldef = &lines[linedef];
			li->linedef = ldef;
			side = LittleShort(ml->side);
			if ((unsigned)(ldef->sidedef[side] - sides) >= (unsigned)numsides)
			{
				throw badseg(2, i, int(ldef->sidedef[side] - sides));
			}
			li->sidedef = ldef->sidedef[side];
			li->frontsector = ldef->sidedef[side]->sector;

			// killough 5/3/98: ignore 2s flag if second sidedef missing:
			if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
			{
				li->backsector = ldef->sidedef[side^1]->sector;
			}
			else
			{
				li->backsector = 0;
				ldef->flags &= ~ML_TWOSIDED;
			}
		}
	}
	catch (const badseg &bad) // the preferred way is to catch by (const) reference.
	{
		switch (bad.badtype)
		{
		case 0:
			Printf ("Seg %d references a nonexistant vertex %d (max %d).\n", bad.badsegnum, bad.baddata, numvertexes);
			break;

		case 1:
			Printf ("Seg %d references a nonexistant linedef %d (max %d).\n", bad.badsegnum, bad.baddata, numlines);
			break;

		case 2:
			Printf ("The linedef for seg %d references a nonexistant sidedef %d (max %d).\n", bad.badsegnum, bad.baddata, numsides);
			break;
		}
		Printf ("The BSP will be rebuilt.\n");
		delete[] segs;
		delete[] subsectors;
		delete[] nodes;
		ForceNodeBuild = true;
	}

	delete[] vertchanged; // phares 10/4/98
	delete[] data;
}